

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O1

void __thiscall FVoxel::Remap(FVoxel *this)

{
  byte bVar1;
  int iVar2;
  BYTE *pBVar3;
  ulong uVar4;
  int i;
  long lVar5;
  byte *pbVar6;
  
  pBVar3 = this->Palette;
  if (pBVar3 != (BYTE *)0x0) {
    if ((GetVoxelRemap(unsigned_char_const*)::firsttime != '\x01') ||
       (iVar2 = bcmp(&GetVoxelRemap(unsigned_char_const*)::oldpal,pBVar3,0x300), iVar2 != 0)) {
      GetVoxelRemap(unsigned_char_const*)::firsttime = '\x01';
      memcpy(&GetVoxelRemap(unsigned_char_const*)::oldpal,pBVar3,0x300);
      pbVar6 = &DAT_01c7a862;
      lVar5 = 0;
      do {
        iVar2 = BestColor((uint32 *)&GPalette,(uint)(pbVar6[-2] >> 4) | (uint)pbVar6[-2] * 4,
                          (uint)(pbVar6[-1] >> 4) | (uint)pbVar6[-1] * 4,
                          (uint)(*pbVar6 >> 4) | (uint)*pbVar6 * 4,1,0xff);
        (&GetVoxelRemap(unsigned_char_const*)::remap)[lVar5] = (char)iVar2;
        lVar5 = lVar5 + 1;
        pbVar6 = pbVar6 + 3;
      } while (lVar5 != 0x100);
    }
    if (0 < this->NumMips) {
      lVar5 = 0;
      do {
        iVar2 = this->Mips[lVar5].OffsetX[this->Mips[lVar5].SizeX];
        if (2 < iVar2) {
          pBVar3 = this->Mips[lVar5].SlabData;
          do {
            bVar1 = pBVar3[1];
            if (bVar1 != 0) {
              uVar4 = 0;
              do {
                pBVar3[uVar4 + 3] = (&GetVoxelRemap(unsigned_char_const*)::remap)[pBVar3[uVar4 + 3]]
                ;
                uVar4 = uVar4 + 1;
              } while (bVar1 != uVar4);
            }
            pBVar3 = pBVar3 + (ulong)bVar1 + 3;
            iVar2 = iVar2 - (bVar1 + 3);
          } while (2 < iVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->NumMips);
    }
    if (this->Palette != (BYTE *)0x0) {
      operator_delete__(this->Palette);
      this->Palette = (BYTE *)0x0;
    }
    return;
  }
  return;
}

Assistant:

void FVoxel::Remap()
{
	if (Palette != NULL)
	{
		BYTE *remap = GetVoxelRemap(Palette);
		for (int i = 0; i < NumMips; ++i)
		{
			RemapVoxelSlabs((kvxslab_t *)Mips[i].SlabData, Mips[i].OffsetX[Mips[i].SizeX], remap);
		}
		RemovePalette();
	}
}